

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void test_cpp_wrapper_get_all(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  undefined4 local_1c;
  int i;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  cpp_wrapper_setup(tc,dict,ion_fill_edge_cases);
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    cpp_wrapper_get(tc,dict,local_1c,local_1c << 1,'\0',1);
  }
  for (local_1c = 0x32; local_1c < 100; local_1c = local_1c + 2) {
    cpp_wrapper_get(tc,dict,local_1c,local_1c * 5,'\0',1);
  }
  for (local_1c = 500; local_1c < 1000; local_1c = local_1c + 5) {
    cpp_wrapper_get(tc,dict,local_1c,local_1c * 10,'\0',1);
  }
  for (local_1c = -100; local_1c < -0x32; local_1c = local_1c + 2) {
    cpp_wrapper_get(tc,dict,local_1c,local_1c * 3,'\0',1);
  }
  return;
}

Assistant:

void
test_cpp_wrapper_get_all(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	cpp_wrapper_setup(tc, dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		cpp_wrapper_get(tc, dict, i, i * 2, err_ok, 1);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		cpp_wrapper_get(tc, dict, i, i * 5, err_ok, 1);
	}
	ION_FILL_HIGH_LOOP(i) {
		cpp_wrapper_get(tc, dict, i, i * 10, err_ok, 1);
	}
	ION_FILL_EDGE_LOOP(i) {
		cpp_wrapper_get(tc, dict, i, i * 3, err_ok, 1);
	}
}